

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx2::create_pipeline
          (ConvolutionDepthWise_x86_avx2 *this,Option *opt)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  _func_int *p_Var4;
  _func_int **pp_Var5;
  ulong uVar6;
  uint uVar7;
  Layer *pLVar8;
  char cVar9;
  int _w;
  ParamDict pd;
  Mat weight_data_tmp;
  Mat local_c8;
  Mat local_78;
  
  p_Var4 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
  if (*(int *)(&this->field_0x160 + (long)p_Var4) != 0) {
    return 0;
  }
  switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var4)) {
  case 1:
    pLVar8 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_c8);
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_c8);
    break;
  case 2:
    pLVar8 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_c8);
    ParamDict::set((ParamDict *)&local_c8,0,**(float **)(&this->field_0x118 + (long)p_Var4));
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_c8);
    break;
  case 3:
    pLVar8 = create_layer(0x36);
    ParamDict::ParamDict((ParamDict *)&local_c8);
    ParamDict::set((ParamDict *)&local_c8,0,**(float **)(&this->field_0x118 + (long)p_Var4));
    ParamDict::set((ParamDict *)&local_c8,1,
                   *(float *)(*(long *)(&this->field_0x118 + (long)p_Var4) + 4));
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_c8);
    break;
  case 4:
    pLVar8 = create_layer(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_c8);
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_c8);
    break;
  case 5:
    pLVar8 = create_layer(0x47);
    ParamDict::ParamDict((ParamDict *)&local_c8);
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_c8);
    break;
  case 6:
    pLVar8 = create_layer(0x43);
    ParamDict::ParamDict((ParamDict *)&local_c8);
    ParamDict::set((ParamDict *)&local_c8,0,**(float **)(&this->field_0x118 + (long)p_Var4));
    ParamDict::set((ParamDict *)&local_c8,1,
                   *(float *)(*(long *)(&this->field_0x118 + (long)p_Var4) + 4));
    (*pLVar8->_vptr_Layer[2])(pLVar8,&local_c8);
    break;
  default:
    pLVar8 = (Layer *)0x0;
    goto LAB_0027e1be;
  }
  ParamDict::~ParamDict((ParamDict *)&local_c8);
LAB_0027e1be:
  if (pLVar8 != (Layer *)0x0) {
    (*pLVar8->_vptr_Layer[4])(pLVar8,opt);
  }
  this->activation = pLVar8;
  if ((opt->use_int8_inference == true) &&
     (*(long *)(&this->field_0x178 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  pp_Var5 = this->_vptr_ConvolutionDepthWise_x86_avx2;
  p_Var4 = pp_Var5[-3];
  uVar1 = *(uint *)(&this->field_0xd4 + (long)p_Var4);
  uVar2 = *(uint *)(&this->field_0xd8 + (long)p_Var4);
  _w = uVar2 * uVar1;
  uVar3 = *(uint *)(&this->field_0x108 + (long)p_Var4);
  uVar6 = (long)*(int *)(&this->field_0x104 + (long)p_Var4) / (long)(int)uVar3;
  uVar6 = (long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) / (long)_w;
  if ((uVar3 == *(uint *)(&this->field_0xd0 + (long)p_Var4)) &&
     (uVar7 = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) /
                   (long)((int)*(uint *)(&this->field_0xd0 + (long)p_Var4) / (int)uVar3)) * uVar3,
     uVar7 == uVar3)) {
    cVar9 = '\x01';
    if (opt->use_packing_layout == true) {
      cVar9 = '\b';
      if ((uVar7 & 7) != 0) {
        cVar9 = ((uVar7 & 3) == 0) * '\x03' + '\x01';
      }
    }
    if (cVar9 == '\x01') {
      if (((((uVar1 ^ 3) == 0 && (uVar2 ^ 3) == 0) &&
           (*(int *)(&this->field_0xdc + (long)p_Var4) == 1)) &&
          (*(int *)(&this->field_0xe0 + (long)p_Var4) == 1)) &&
         ((*(int *)(&this->field_0xe4 + (long)p_Var4) == 1 &&
          (*(int *)(&this->field_0xe8 + (long)p_Var4) == 1)))) {
        return 0;
      }
      if ((((uVar1 ^ 3) == 0 && (uVar2 ^ 3) == 0) &&
          (*(int *)(&this->field_0xdc + (long)p_Var4) == 1)) &&
         ((*(int *)(&this->field_0xe0 + (long)p_Var4) == 1 &&
          ((*(int *)(&this->field_0xe4 + (long)p_Var4) == 2 &&
           (*(int *)(&this->field_0xe8 + (long)p_Var4) == 2)))))) {
        return 0;
      }
    }
    else {
      if (cVar9 == '\x04') {
        Mat::reshape(&local_c8,(Mat *)(&this->field_0x168 + (long)pp_Var5[-3]),_w,
                     *(int *)(&this->field_0x108 + (long)pp_Var5[-3]),(Allocator *)0x0);
        convert_packing(&local_c8,&this->weight_data_packed,4,opt);
        if (local_c8.refcount == (int *)0x0) {
          return 0;
        }
        LOCK();
        *local_c8.refcount = *local_c8.refcount + -1;
        UNLOCK();
        if (*local_c8.refcount != 0) {
          return 0;
        }
        if (local_c8.allocator != (Allocator *)0x0) {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
          return 0;
        }
LAB_0027e59a:
        if (local_c8.data == (void *)0x0) {
          return 0;
        }
        free(local_c8.data);
        return 0;
      }
      if (cVar9 == '\b') {
        if (((((((uVar1 ^ 3) == 0 && (uVar2 ^ 3) == 0) & opt->use_weight_fp16_storage) == 1) &&
             (*(int *)(&this->field_0xdc + (long)p_Var4) == 1)) &&
            (*(int *)(&this->field_0xe0 + (long)p_Var4) == 1)) &&
           ((*(int *)(&this->field_0xe4 + (long)p_Var4) == 1 &&
            (*(int *)(&this->field_0xe8 + (long)p_Var4) == 1)))) {
          Mat::reshape(&local_c8,(Mat *)(&this->field_0x168 + (long)pp_Var5[-3]),_w,
                       *(int *)(&this->field_0x108 + (long)pp_Var5[-3]),(Allocator *)0x0);
          local_78.cstep = 0;
          local_78.data = (void *)0x0;
          local_78.refcount._0_4_ = 0;
          local_78.refcount._4_4_ = 0;
          local_78.elemsize._0_4_ = 0;
          local_78._20_8_ = 0;
          local_78.allocator = (Allocator *)0x0;
          local_78.dims = 0;
          local_78.w = 0;
          local_78.h = 0;
          local_78.d = 0;
          local_78.c = 0;
          convert_packing(&local_c8,&local_78,8,opt);
          cast_float32_to_float16(&local_78,&this->weight_data_packed,opt);
        }
        else {
          if ((((((uVar1 ^ 3) == 0 && (uVar2 ^ 3) == 0) & opt->use_weight_fp16_storage) != 1) ||
              ((*(int *)(&this->field_0xdc + (long)p_Var4) != 1 ||
               (*(int *)(&this->field_0xe0 + (long)p_Var4) != 1)))) ||
             ((*(int *)(&this->field_0xe4 + (long)p_Var4) != 2 ||
              (*(int *)(&this->field_0xe8 + (long)p_Var4) != 2)))) {
            Mat::reshape(&local_c8,(Mat *)(&this->field_0x168 + (long)pp_Var5[-3]),_w,
                         *(int *)(&this->field_0x108 + (long)pp_Var5[-3]),(Allocator *)0x0);
            convert_packing(&local_c8,&this->weight_data_packed,8,opt);
            if (local_c8.refcount == (int *)0x0) {
              return 0;
            }
            LOCK();
            *local_c8.refcount = *local_c8.refcount + -1;
            UNLOCK();
            if (*local_c8.refcount != 0) {
              return 0;
            }
            if (local_c8.allocator != (Allocator *)0x0) {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
              return 0;
            }
            goto LAB_0027e59a;
          }
          Mat::reshape(&local_c8,(Mat *)(&this->field_0x168 + (long)pp_Var5[-3]),_w,
                       *(int *)(&this->field_0x108 + (long)pp_Var5[-3]),(Allocator *)0x0);
          local_78.cstep = 0;
          local_78.data = (void *)0x0;
          local_78.refcount._0_4_ = 0;
          local_78.refcount._4_4_ = 0;
          local_78.elemsize._0_4_ = 0;
          local_78._20_8_ = 0;
          local_78.allocator = (Allocator *)0x0;
          local_78.dims = 0;
          local_78.w = 0;
          local_78.h = 0;
          local_78.d = 0;
          local_78.c = 0;
          convert_packing(&local_c8,&local_78,8,opt);
          cast_float32_to_float16(&local_78,&this->weight_data_packed,opt);
        }
        Mat::~Mat(&local_78);
        Mat::~Mat(&local_c8);
        return 0;
      }
    }
  }
  create_group_ops(this,opt);
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx2::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
        // pack8
        if (elempack == 8)
        {
#if __AVX2__
            if (opt.use_weight_fp16_storage && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                Mat weight_data_r2 = weight_data.reshape(maxk, group);
                Mat weight_data_tmp;
                convert_packing(weight_data_r2, weight_data_tmp, 8, opt);
                ncnn::cast_float32_to_float16(weight_data_tmp, weight_data_packed, opt);
                return 0;
            }
            if (opt.use_weight_fp16_storage && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                Mat weight_data_r2 = weight_data.reshape(maxk, group);
                Mat weight_data_tmp;
                convert_packing(weight_data_r2, weight_data_tmp, 8, opt);
                ncnn::cast_float32_to_float16(weight_data_tmp, weight_data_packed, opt);
                return 0;
            }
#endif
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_packed, 8, opt);

            return 0;
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_packed, 4, opt);

            return 0;
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            // depth-wise specific
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
            {
                return 0;
            }
            if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
            {
                return 0;
            }
        }
    }

    // group convolution
    create_group_ops(opt);

    return 0;
}